

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

PMJ02BNSampler *
pbrt::PMJ02BNSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  int *piVar2;
  PMJ02BNSampler *pPVar3;
  int nsamp;
  allocator<char> local_45;
  int seed;
  string local_40;
  Allocator alloc_local;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"pixelsamples",(allocator<char> *)&seed);
  iVar1 = ParameterDictionary::GetOneInt(parameters,&local_40,0x10);
  std::__cxx11::string::~string((string *)&local_40);
  nsamp = iVar1;
  if ((char)Options[8] == '\x01') {
    piVar2 = pstd::optional<int>::value((optional<int> *)(Options + 7));
    nsamp = *piVar2;
  }
  if ((char)Options[0xb] == '\x01') {
    nsamp = 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"seed",&local_45);
  iVar1 = ParameterDictionary::GetOneInt(parameters,&local_40,*Options);
  std::__cxx11::string::~string((string *)&local_40);
  seed = iVar1;
  pPVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::PMJ02BNSampler,int&,int&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&nsamp,&seed,&alloc_local);
  return pPVar3;
}

Assistant:

PMJ02BNSampler *PMJ02BNSampler::Create(const ParameterDictionary &parameters,
                                       const FileLoc *loc, Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;
    int seed = parameters.GetOneInt("seed", Options->seed);
    return alloc.new_object<PMJ02BNSampler>(nsamp, seed, alloc);
}